

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deserializer.hpp
# Opt level: O1

void mserialize::detail::
     BuiltinDeserializer<std::__cxx11::list<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>,_void>
     ::deserialize_elems_noinsert<InputStream>
               (undefined8 *param_1,undefined8 param_2,undefined8 *param_3)

{
  undefined8 *puVar1;
  
  for (puVar1 = (undefined8 *)*param_1; puVar1 != param_1; puVar1 = (undefined8 *)*puVar1) {
    std::istream::read((char *)*param_3,(long)puVar1 + 0x14);
    std::istream::read((char *)*param_3,(long)(puVar1 + 2));
  }
  return;
}

Assistant:

static void deserialize_elems_noinsert(
    std::false_type /* no batch deserialization */,
    std::false_type /* not a proxy sequence */,
    Sequence& s, std::uint32_t /*size*/, InputStream& istream
  )
  {
    for (auto&& elem : s)
    {
      mserialize::deserialize(elem, istream);
    }
  }